

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

qreal __thiscall QGraphicsItem::boundingRegionGranularity(QGraphicsItem *this)

{
  QGraphicsItemPrivate *pQVar1;
  bool bVar2;
  long lVar3;
  QMetaType QVar4;
  anon_union_24_3_e3d07ef4_for_data *paVar5;
  QVariant *pQVar6;
  long in_FS_OFFSET;
  undefined4 uVar7;
  undefined4 uVar8;
  QMetaType local_48;
  QMetaType local_40;
  anon_union_24_3_e3d07ef4_for_data local_38;
  ulong local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  uVar7 = 0;
  uVar8 = 0;
  if ((pQVar1->field_0x162 & 0x80) != 0) {
    lVar3 = (pQVar1->extras).d.size;
    if (lVar3 != 0) {
      pQVar6 = &((pQVar1->extras).d.ptr)->value;
      do {
        if (*(int *)&pQVar6[-1].d.field_0x18 == 4) {
          ::QVariant::QVariant((QVariant *)&local_38,pQVar6);
          local_48.d_ptr = (QMetaTypeInterface *)(local_20 & 0xfffffffffffffffc);
          goto LAB_005dfd9e;
        }
        pQVar6 = (QVariant *)((long)&pQVar6[1].d.data + 8);
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    local_38.shared = (PrivateShared *)0x0;
    local_38._8_8_ = 0;
    local_38._16_8_ = 0;
    local_20 = 2;
    local_48.d_ptr = (QMetaTypeInterface *)0x0;
LAB_005dfd9e:
    local_40.d_ptr = (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<double>::metaType;
    bVar2 = comparesEqual(&local_48,&local_40);
    if (bVar2) {
      if ((local_20 & 1) == 0) {
        uVar7 = SUB84(local_38.shared,0);
        uVar8 = (undefined4)((ulong)local_38._0_8_ >> 0x20);
      }
      else {
        uVar7 = (undefined4)*(undefined8 *)(local_38.shared + *(int *)(local_38.shared + 4));
        uVar8 = (undefined4)
                ((ulong)*(undefined8 *)(local_38.shared + *(int *)(local_38.shared + 4)) >> 0x20);
      }
    }
    else {
      local_48.d_ptr = (QMetaTypeInterface *)0x0;
      paVar5 = &local_38;
      QVar4.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((local_20 & 1) != 0) {
        paVar5 = (anon_union_24_3_e3d07ef4_for_data *)
                 (local_38.shared + *(int *)(local_38.shared + 4));
      }
      QMetaType::convert(QVar4,paVar5,local_40,&local_48);
      uVar7 = SUB84(local_48.d_ptr,0);
      uVar8 = (undefined4)((ulong)local_48.d_ptr >> 0x20);
    }
    ::QVariant::~QVariant((QVariant *)&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (qreal)CONCAT44(uVar8,uVar7);
  }
  __stack_chk_fail();
}

Assistant:

qreal QGraphicsItem::boundingRegionGranularity() const
{
    return d_ptr->hasBoundingRegionGranularity
        ? qvariant_cast<qreal>(d_ptr->extra(QGraphicsItemPrivate::ExtraBoundingRegionGranularity))
        : 0;
}